

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<solitaire::geometry::Position> *
testing::internal::ActionResultHolder<solitaire::geometry::Position>::
PerformAction<solitaire::geometry::Position(unsigned_int)>
          (Action<solitaire::geometry::Position_(unsigned_int)> *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<solitaire::geometry::Position> *this_00;
  tuple<unsigned_int> local_2c;
  Result local_28;
  Position local_20;
  tuple<unsigned_int> *local_18;
  ArgumentTuple *args_local;
  Action<solitaire::geometry::Position_(unsigned_int)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<solitaire::geometry::Position> *)operator_new(0x10);
  this = args_local;
  std::tuple<unsigned_int>::tuple(&local_2c,local_18);
  local_28 = Action<solitaire::geometry::Position_(unsigned_int)>::Perform
                       ((Action<solitaire::geometry::Position_(unsigned_int)> *)this,&local_2c);
  ReferenceOrValueWrapper<solitaire::geometry::Position>::ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<solitaire::geometry::Position> *)&local_20,local_28);
  ActionResultHolder(this_00,(Wrapper)local_20);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }